

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O1

void __thiscall irr::video::CImage::copyTo(CImage *this,IImage *target,vector2d<int> *pos)

{
  bool bVar1;
  s32 sVar2;
  
  sVar2 = Blit(BLITTER_TEXTURE,target,(rect<int> *)0x0,pos,&this->super_IImage,(rect<int> *)0x0,0);
  if ((((target != (IImage *)0x0) && (sVar2 == 0)) && (pos->X == 0)) && (pos->Y == 0)) {
    bVar1 = CColorConverter::canConvertFormat((this->super_IImage).Format,target->Format);
    if (bVar1) {
      (*(this->super_IImage)._vptr_IImage[5])
                (this,target->Data,(ulong)(target->Size).Width,(ulong)(target->Size).Height,
                 (ulong)target->Format,(ulong)target->Pitch);
      return;
    }
  }
  return;
}

Assistant:

void CImage::copyTo(IImage *target, const core::position2d<s32> &pos)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyTo method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	if (!Blit(BLITTER_TEXTURE, target, 0, &pos, this, 0, 0) && target && pos.X == 0 && pos.Y == 0 &&
			CColorConverter::canConvertFormat(Format, target->getColorFormat())) {
		// No fast blitting, but copyToScaling uses other color conversions and might work
		irr::core::dimension2du dim(target->getDimension());
		copyToScaling(target->getData(), dim.Width, dim.Height, target->getColorFormat(), target->getPitch());
	}
}